

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGen::Quoted_abi_cxx11_(string *__return_storage_ptr__,cmQtAutoGen *this,string_view text)

{
  long lVar1;
  allocator<char> local_52;
  char local_51;
  string res;
  string_view text_local;
  
  text_local._M_str = (char *)text._M_len;
  text_local._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&res,&text_local,&local_52);
  for (lVar1 = 8; lVar1 != 0x98; lVar1 = lVar1 + 0x10) {
    cmsys::SystemTools::ReplaceString
              (&res,*(char **)((long)&PTR___cxa_pure_virtual_00aa9a40 + lVar1),
               *(char **)((long)&Quoted[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)
                                 ::replacements + lVar1));
  }
  local_52 = (allocator<char>)0x22;
  local_51 = '\"';
  cmStrCat<char,std::__cxx11::string&,char>(__return_storage_ptr__,(char *)&local_52,&res,&local_51)
  ;
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Quoted(cm::string_view text)
{
  static std::initializer_list<std::pair<const char*, const char*>> const
    replacements = { { "\\", "\\\\" }, { "\"", "\\\"" }, { "\a", "\\a" },
                     { "\b", "\\b" },  { "\f", "\\f" },  { "\n", "\\n" },
                     { "\r", "\\r" },  { "\t", "\\t" },  { "\v", "\\v" } };

  std::string res(text);
  for (auto const& pair : replacements) {
    cmSystemTools::ReplaceString(res, pair.first, pair.second);
  }
  return cmStrCat('"', res, '"');
}